

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O2

void __thiscall
wasm::WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_>::run
          (WalkerPass<wasm::PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>_> *this,
          Module *module)

{
  int iVar1;
  PassOptions local_288;
  PassOptions local_1d0;
  undefined1 local_118 [8];
  PassRunner runner;
  
  if ((this->super_Pass).runner == (PassRunner *)0x0) {
    __assert_fail("getPassRunner()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                  ,0x203,
                  "virtual void wasm::WalkerPass<wasm::PostWalker<Replacer>>::run(Module *) [WalkerType = wasm::PostWalker<Replacer>]"
                 );
  }
  iVar1 = (*(this->super_Pass)._vptr_Pass[4])();
  if ((char)iVar1 != '\0') {
    PassOptions::PassOptions(&local_288,&((this->super_Pass).runner)->options);
    local_288.optimizeLevel =
         ~-(uint)(local_288.optimizeLevel < 1) & 1 |
         local_288.optimizeLevel & -(uint)(local_288.optimizeLevel < 1);
    local_288.shrinkLevel =
         ~-(uint)(local_288.shrinkLevel < 1) & 1 |
         local_288.shrinkLevel & -(uint)(local_288.shrinkLevel < 1);
    PassOptions::PassOptions(&local_1d0,&local_288);
    PassRunner::PassRunner((PassRunner *)local_118,module,&local_1d0);
    PassOptions::~PassOptions(&local_1d0);
    runner.options.passesToSkip._M_h._M_single_bucket._0_1_ = 1;
    (*(this->super_Pass)._vptr_Pass[5])(&runner.isNested,this);
    PassRunner::add((PassRunner *)local_118,
                    (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)&runner.isNested);
    if (runner._232_8_ != 0) {
      (**(code **)(*(long *)runner._232_8_ + 8))();
    }
    runner.isNested = false;
    runner.addedPassesRemovedDWARF = false;
    runner._234_6_ = 0;
    PassRunner::run((PassRunner *)local_118);
    PassRunner::~PassRunner((PassRunner *)local_118);
    PassOptions::~PassOptions(&local_288);
    return;
  }
  Walker<Replacer,_wasm::Visitor<Replacer,_void>_>::walkModule
            (&(this->super_PostWalker<Replacer,_wasm::Visitor<Replacer,_void>_>).
              super_Walker<Replacer,_wasm::Visitor<Replacer,_void>_>,module);
  return;
}

Assistant:

void run(Module* module) override {
    assert(getPassRunner());
    // Parallel pass running is implemented in the PassRunner.
    if (isFunctionParallel()) {
      // Reduce opt/shrink levels to a maximum of one in nested runners like
      // these, to balance runtime. We definitely want the full levels in the
      // main passes we run, but nested pass runners are of secondary
      // importance.
      // TODO Investigate the impact of allowing the levels to just pass
      //      through. That seems to cause at least some regression in compile
      //      times in -O3, however, but with careful measurement we may find
      //      the benefits are worth it. For now -O1 is a reasonable compromise
      //      as it has basically linear runtime, unlike -O2 and -O3.
      auto options = getPassOptions();
      options.optimizeLevel = std::min(options.optimizeLevel, 1);
      options.shrinkLevel = std::min(options.shrinkLevel, 1);
      PassRunner runner(module, options);
      runner.setIsNested(true);
      runner.add(create());
      runner.run();
      return;
    }
    // Single-thread running just calls the walkModule traversal.
    WalkerType::walkModule(module);
  }